

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_convert.cpp
# Opt level: O2

void test_char<char>(void)

{
  int iVar1;
  ostream *poVar2;
  ctype *pcVar3;
  char *pcVar4;
  allocator local_282;
  allocator local_281;
  generator gen;
  locale l_3;
  string real_name;
  string name;
  locale l;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  booster::locale::generator::generator(&gen);
  poVar2 = std::operator<<((ostream *)&std::cout,"- Testing at least C");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&name,"en_US.UTF-8",(allocator *)&real_name);
  booster::locale::generator::generate((string *)&l);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string((string *)&local_30,"Hello World i",(allocator *)&name);
  std::__cxx11::string::string((string *)&local_50,"hello world i",(allocator *)&real_name);
  std::__cxx11::string::string((string *)&local_70,"HELLO WORLD I",(allocator *)&l_3);
  test_one<char>(&l,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&l_3,"en_US.UTF-8",(allocator *)&local_210);
  get_std_name(&real_name,(string *)&l_3,(string *)0x0);
  std::__cxx11::string::operator=((string *)&name,(string *)&real_name);
  std::__cxx11::string::~string((string *)&real_name);
  std::__cxx11::string::~string((string *)&l_3);
  if (name._M_string_length == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"- en_US.UTF-8 is not supported, skipping");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"- Testing ");
    poVar2 = std::operator<<(poVar2,(string *)&name);
    std::endl<char,std::char_traits<char>>(poVar2);
    booster::locale::generator::generate((string *)&real_name);
    std::__cxx11::string::string((string *)&local_90,anon_var_dwarf_38f9,(allocator *)&l_3);
    std::__cxx11::string::string((string *)&local_b0,anon_var_dwarf_3903,(allocator *)&local_210);
    std::__cxx11::string::string((string *)&local_d0,anon_var_dwarf_390d,&local_282);
    test_one<char>((locale *)&real_name,&local_90,&local_b0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::locale::~locale((locale *)&real_name);
  }
  std::__cxx11::string::string((string *)&l_3,"en_US.ISO8859-1",(allocator *)&local_210);
  get_std_name(&real_name,(string *)&l_3,(string *)0x0);
  std::__cxx11::string::operator=((string *)&name,(string *)&real_name);
  std::__cxx11::string::~string((string *)&real_name);
  std::__cxx11::string::~string((string *)&l_3);
  if (name._M_string_length == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"- en_US.ISO8859-1 is not supported, skipping");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar2 = std::operator<<(poVar2,(string *)&name);
    std::endl<char,std::char_traits<char>>(poVar2);
    booster::locale::generator::generate((string *)&real_name);
    std::__cxx11::string::string((string *)&local_f0,"Hello World",(allocator *)&l_3);
    std::__cxx11::string::string((string *)&local_110,"hello world",(allocator *)&local_210);
    std::__cxx11::string::string((string *)&local_130,"HELLO WORLD",&local_282);
    test_one<char>((locale *)&real_name,&local_f0,&local_110,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string((string *)&local_150,anon_var_dwarf_38f9,(allocator *)&l_3);
    std::__cxx11::string::string((string *)&local_170,anon_var_dwarf_3903,(allocator *)&local_210);
    std::__cxx11::string::string((string *)&local_190,anon_var_dwarf_390d,&local_282);
    test_one<char>((locale *)&real_name,&local_150,&local_170,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::locale::~locale((locale *)&real_name);
  }
  real_name._M_dataplus._M_p = (pointer)&real_name.field_2;
  real_name._M_string_length = 0;
  real_name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_210,"tr_TR.UTF-8",&local_282);
  get_std_name((string *)&l_3,&local_210,&real_name);
  std::__cxx11::string::operator=((string *)&name,(string *)&l_3);
  std::__cxx11::string::~string((string *)&l_3);
  std::__cxx11::string::~string((string *)&local_210);
  if (name._M_string_length == 0) {
    pcVar4 = "- tr_TR.UTF-8 is not supported, skipping";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar2 = std::operator<<(poVar2,(string *)&name);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::locale::locale(&l_3,real_name._M_dataplus._M_p);
    pcVar3 = std::use_facet<std::ctype<wchar_t>>(&l_3);
    iVar1 = (**(code **)(*(long *)pcVar3 + 0x30))(pcVar3,0x69);
    std::locale::~locale(&l_3);
    if (iVar1 != 0x49) {
      booster::locale::generator::generate((string *)&l_3);
      std::__cxx11::string::string((string *)&local_1b0,"i",(allocator *)&local_210);
      std::__cxx11::string::string((string *)&local_1d0,"i",&local_282);
      std::__cxx11::string::string((string *)&local_1f0,anon_var_dwarf_3995,&local_281);
      test_one<char>(&l_3,&local_1b0,&local_1d0,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::locale::~locale(&l_3);
      goto LAB_00104d24;
    }
    pcVar4 = "Standard library does not support this locale\'s case conversion correctly";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
LAB_00104d24:
  std::__cxx11::string::~string((string *)&real_name);
  std::__cxx11::string::~string((string *)&name);
  std::locale::~locale(&l);
  booster::locale::generator::~generator(&gen);
  return;
}

Assistant:

void test_char()
{
    booster::locale::generator gen;

    std::cout << "- Testing at least C" << std::endl;

    std::locale l = gen("en_US.UTF-8");

    test_one<CharType>(l,"Hello World i","hello world i","HELLO WORLD I");

    std::string name;

    name = get_std_name("en_US.UTF-8");
    if(!name.empty()) {
        std::cout << "- Testing " << name << std::endl;
        std::locale l=gen(name);
        test_one<CharType>(l,"Façade","façade","FAÇADE");
    }
    else {
        std::cout << "- en_US.UTF-8 is not supported, skipping" << std::endl;
    }

    name = get_std_name("en_US.ISO8859-1");
    if(!name.empty()) {
        std::cout << "Testing " << name << std::endl;
        std::locale l=gen(name);
        test_one<CharType>(l,"Hello World","hello world","HELLO WORLD");
        test_one<CharType>(l,"Façade","façade","FAÇADE");
    }
    else {
        std::cout << "- en_US.ISO8859-1 is not supported, skipping" << std::endl;
    }
    std::string real_name;
    name = get_std_name("tr_TR.UTF-8",&real_name);
    if(!name.empty()) {
        std::cout << "Testing " << name << std::endl;
        if(std::use_facet<std::ctype<wchar_t> >(std::locale(real_name.c_str())).toupper(L'i')!=L'I') {
            std::locale l=gen(name);
            test_one<CharType>(l,"i","i","İ");
        }
        else {
            std::cout << "Standard library does not support this locale's case conversion correctly" << std::endl;
        }
    }
    else 
    {
        std::cout << "- tr_TR.UTF-8 is not supported, skipping" << std::endl;
    }
}